

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::pp_define(CTcTokenizer *this)

{
  utf8_ptr *p;
  CTcToken *tok;
  int *str;
  size_t len;
  char *__s;
  byte bVar1;
  tc_toktyp_t tVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t expan_len;
  CTcHashEntryPpDefine *this_00;
  CVmHashEntry *entry;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  CVmHashEntry *pCVar9;
  byte *p_00;
  long lVar10;
  int local_860;
  int local_858;
  size_t argvlen [128];
  char *argv [128];
  undefined4 extraout_var;
  
  p = &this->p_;
  tok = &this->curtok_;
  tVar2 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
  if (tVar2 == TOKT_SYM) {
    local_860 = 0;
    str = (int *)(this->curtok_).text_;
    len = (this->curtok_).text_len_;
    wVar3 = utf8_ptr::s_getch((this->p_).p_);
    local_858 = 0;
    iVar6 = 0;
    if (wVar3 == L'(') {
      bVar1 = *p->p_;
      p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
      tVar2 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
      local_858 = 1;
      if (tVar2 != TOKT_RPAR) {
        lVar10 = 0;
        do {
          if (tVar2 != TOKT_SYM) {
            if (tVar2 != TOKT_EOF) {
              iVar6 = 0x271b;
              goto LAB_0021c4d7;
            }
            iVar6 = 0x271a;
            goto LAB_0021c4a1;
          }
          argvlen[lVar10] = (this->curtok_).text_len_;
          argv[lVar10] = (this->curtok_).text_;
          tVar2 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
          if (tVar2 != TOKT_COMMA) {
            if (tVar2 == TOKT_RPAR) {
              local_860 = 0;
LAB_0021c4c2:
              iVar6 = (int)lVar10 + 1;
              goto LAB_0021c1b3;
            }
            if (tVar2 == TOKT_ELLIPSIS) {
              tVar2 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
              local_860 = 1;
              if (tVar2 == TOKT_RPAR) goto LAB_0021c4c2;
              iVar6 = 0x2749;
            }
            else {
              iVar6 = 0x271c;
            }
LAB_0021c4d7:
            log_error_or_warning_with_tok(this,TC_SEV_ERROR,iVar6,tok);
            goto LAB_0021c4df;
          }
          lVar10 = lVar10 + 1;
          tVar2 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
        } while (lVar10 != 0x80);
        log_error(0x2735,str,len,0x80);
        goto LAB_0021c4df;
      }
      local_860 = 0;
      iVar6 = 0;
    }
LAB_0021c1b3:
    wVar4 = utf8_ptr::s_getch(p->p_);
    while (((uint)wVar4 < 0x80 && (iVar5 = isspace(wVar4), iVar5 != 0))) {
      bVar1 = *p->p_;
      p_00 = (byte *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
      p->p_ = (char *)p_00;
      wVar4 = utf8_ptr::s_getch((char *)p_00);
    }
    __s = p->p_;
    if ((len == 7) && (*(int *)((long)str + 3) == 0x64656e69 && *str == 0x69666564)) {
      iVar6 = 0x2742;
LAB_0021c4a1:
      log_error(iVar6);
    }
    else {
      expan_len = strlen(__s);
      if (expan_len == 0) {
LAB_0021c282:
        expan_len = 0;
      }
      else {
        bVar1 = __s[expan_len - 1];
        while ((-1 < (char)bVar1 && (iVar5 = isspace((uint)bVar1), iVar5 != 0))) {
          if (expan_len == 1) goto LAB_0021c282;
          if (__s[expan_len - 2] == '\\') break;
          bVar1 = __s[expan_len - 2];
          expan_len = expan_len - 1;
        }
      }
      this_00 = (CTcHashEntryPpDefine *)operator_new(0x68);
      CTcHashEntryPpDefine::CTcHashEntryPpDefine
                (this_00,(textchar_t *)str,len,1,local_858,iVar6,local_860,argv,argvlen,__s,
                 expan_len);
      iVar5 = (*this->defines_->_vptr_CTcMacroTable[4])(this->defines_,str,len);
      entry = (CVmHashEntry *)CONCAT44(extraout_var,iVar5);
      if (entry != (CVmHashEntry *)0x0) {
        if (((wVar3 == L'(') != ((entry[1].len_ & 0x100000000) == 0)) &&
           ((int)entry[1].len_ == iVar6)) {
          iVar6 = (*(this_00->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry.
                    _vptr_CVmHashEntry[3])(this_00);
          iVar5 = (*(this_00->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry.
                    _vptr_CVmHashEntry[4])(this_00);
          iVar7 = (*entry->_vptr_CVmHashEntry[3])(entry);
          iVar8 = (*entry->_vptr_CVmHashEntry[4])(entry);
          iVar6 = lib_strequal_collapse_spaces
                            ((char *)CONCAT44(extraout_var_00,iVar6),CONCAT44(extraout_var_01,iVar5)
                             ,(char *)CONCAT44(extraout_var_02,iVar7),
                             CONCAT44(extraout_var_03,iVar8));
          if (iVar6 != 0) {
            (*(this_00->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry[1])(this_00);
            goto LAB_0021c4df;
          }
        }
        log_warning(0x271d,len & 0xffffffff,str);
        (*this->defines_->_vptr_CTcMacroTable[3])(this->defines_,entry);
        pCVar9 = CVmHashTable::find(this->undefs_,(char *)str,len);
        if (pCVar9 == (CVmHashEntry *)0x0) {
          CVmHashTable::add(this->undefs_,entry);
        }
        else {
          (*entry->_vptr_CVmHashEntry[1])(entry);
        }
      }
      (*this->defines_->_vptr_CTcMacroTable[2])(this->defines_,this_00);
    }
  }
  else {
    log_error(0x2718,(ulong)(uint)(this->curtok_).text_len_,(this->curtok_).text_);
  }
LAB_0021c4df:
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  return;
}

Assistant:

void CTcTokenizer::pp_define()
{
    const char *macro_name;
    size_t macro_len;
    const char *argv[TOK_MAX_MACRO_ARGS];
    size_t argvlen[TOK_MAX_MACRO_ARGS];
    int argc;
    int has_args;
    const char *expan;
    size_t expan_len;
    CTcHashEntryPp *entry, *old_entry;
    int has_varargs;

    /* get the macro name */
    if (next_on_line() != TOKT_SYM)
    {
        log_error(TCERR_BAD_DEFINE_SYM,
                  (int)curtok_.get_text_len(), curtok_.get_text());
        clear_linebuf();
        return;
    }

    /* make a copy of the macro name */
    macro_name = curtok_.get_text();
    macro_len = curtok_.get_text_len();

    /* no arguments yet */
    argc = 0;

    /* presume we won't find a varargs marker */
    has_varargs = FALSE;

    /* 
     *   If there's a '(' immediately after the macro name, without any
     *   intervening whitespace, it has arguments; otherwise, it has no
     *   arguments.  Note which case we have.  
     */
    if (p_.getch() == '(')
    {
        int done;
        tc_toktyp_t tok;
        
        /* note that we have an argument list */
        has_args = TRUE;

        /* assume we're not done yet */
        done = FALSE;

        /* skip the paren and get the next token */
        p_.inc();
        tok = next_on_line();

        /* check for an empty argument list */
        if (tok == TOKT_RPAR)
        {
            /* note that we're done with the arguments */
            done = TRUE;
        }

        /* scan the argument list */
        while (!done)
        {
            /* if we have too many arguments, it's an error */
            if (argc >= TOK_MAX_MACRO_ARGS)
            {
                log_error(TCERR_TOO_MANY_MAC_PARMS,
                          macro_name, macro_len, TOK_MAX_MACRO_ARGS);
                clear_linebuf();
                return;
            }

            /* if we're at the end of the macro, it's an error */
            if (tok == TOKT_EOF)
            {
                /* log the error and ignore the line */
                log_error(TCERR_MACRO_NO_RPAR);
                clear_linebuf();
                return;
            }

            /* check for a valid initial symbol character */
            if (tok != TOKT_SYM)
            {
                log_error_curtok(TCERR_BAD_MACRO_ARG_NAME);
                clear_linebuf();
                return;
            }

            /* remember the argument name */
            argvlen[argc] = curtok_.get_text_len();
            argv[argc++] = curtok_.get_text();

            /* get the next token */
            tok = next_on_line();

            /* make sure we have a comma or paren following */
            if (tok == TOKT_COMMA)
            {
                /* we have more arguments - skip the comma */
                tok = next_on_line();
            }
            else if (tok == TOKT_ELLIPSIS)
            {
                /* skip the ellipsis */
                tok = next_on_line();

                /* note the varargs marker */
                has_varargs = TRUE;

                /* this must be the last argument */
                if (tok != TOKT_RPAR)
                {
                    /* log the error */
                    log_error_curtok(TCERR_MACRO_ELLIPSIS_REQ_RPAR);

                    /* discard the line and give up */
                    clear_linebuf();
                    return;
                }

                /* that's the last argument - we can stop now */
                done = TRUE;
            }
            else if (tok == TOKT_RPAR)
            {
                /* no more arguments - note that we can stop now */
                done = TRUE;
            }
            else
            {
                /* invalid argument - log an error and discard the line */
                log_error_curtok(TCERR_MACRO_EXP_COMMA);
                clear_linebuf();
                return;
            }
        }
    }
    else
    {
        /* 
         *   there are no arguments - the macro's expansion starts
         *   immediately after the end of the name and any subsequent
         *   whitespace 
         */
        has_args = FALSE;
    }

    /* skip whitespace leading up to the expansion */
    while (is_space(p_.getch()))
        p_.inc();

    /* the rest of the line is the expansion */
    expan = p_.getptr();

    /* don't allow defining "defined" */
    if (macro_len == 7 && memcmp(macro_name, "defined", 7) == 0)
    {
        /* log an error */
        log_error(TCERR_REDEF_OP_DEFINED);

        /* don't retain the directive in the preprocessed result */
        clear_linebuf();

        /* ignore the definition */
        return;
    }

    /* get the length of the expansion text */
    expan_len = strlen(expan);

    /* 
     *   remove any trailing whitespace from the expansion text; however,
     *   leave a trailing space if it's preceded by a backslash 
     */
    while (expan_len > 0
           && is_space(expan[expan_len-1])
           && !(expan_len > 1 && expan[expan_len-2] == '\\'))
        --expan_len;

    /* create an entry for the new macro */
    entry = new CTcHashEntryPpDefine(macro_name, macro_len, TRUE,
                                     has_args, argc, has_varargs,
                                     argv, argvlen, expan, expan_len);

    /* 
     *   Check the symbol table to see if this symbol is already defined with
     *   a different expansion.  If so, show a warning, but honor the new
     *   definition.  
     */
    old_entry = find_define(macro_name, macro_len);
    if (old_entry != 0)
    {
        /*
         *   Check for a trivial redefinition - if the number of arguments is
         *   the same, and the type (object-like or function-like) is the
         *   same, and the expansion string is identical, there's no need to
         *   warn, because the redefinition has no effect and can thus be
         *   safely ignored.  Note that we must ignore any differences in the
         *   whitespace in the expansions for this comparision.
         *   
         *   Compare the *parsed* versions of the expansions.  This ensures
         *   that we take into account changes to parameter names.  For
         *   example, the following two macros are equivalent, even though
         *   their unparsed source texts are different, because they'd still
         *   have identical expansions for any given parameter value:
         *   
         *.    #define A(x) x
         *.    #define A(y) y
         *   
         *   Likewise, the following two macros are NOT equivalent, even
         *   though their unparsed source texts are identical, because they
         *   could have different expansions for a given parameter value:
         *   
         *.    #define A(x) x
         *.    #define A(y) x
         */
        if ((old_entry->has_args() != 0) == (has_args != 0)
            && old_entry->get_argc() == argc
            && lib_strequal_collapse_spaces(entry->get_expansion(),
                                            entry->get_expan_len(),
                                            old_entry->get_expansion(),
                                            old_entry->get_expan_len()))
        {
            /* it's a non-trivial redefinition - ignore it */
            delete entry;
            goto done;
        }

        /* log a warning about the redefinition */
        log_warning(TCERR_MACRO_REDEF, (int)macro_len, macro_name);

        /* remove and delete the old entry */
        defines_->remove(old_entry);

        /* if the item isn't already in the #undef table, add it */
        if (find_undef(macro_name, macro_len) == 0)
        {
            /* 
             *   move the entry to the #undef table so that we can keep track
             *   of the fact that this macro's definition has changed in the
             *   course of the compilation 
             */
            undefs_->add(old_entry);
        }
        else
        {
            /* 
             *   the name is already in the #undef table, so we don't need
             *   another copy - just forget about the old entry entirely 
             */
            delete old_entry;
        }
    }

    /* add it to the hash table */
    defines_->add(entry);

done:
    /* don't retain the directive in the preprocessed source */
    clear_linebuf();
}